

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWriteFileCommand.cxx
# Opt level: O2

bool __thiscall
cmWriteFileCommand::InitialPass
          (cmWriteFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *fileName;
  _Ios_Openmode _Var1;
  cmCommand *this_00;
  bool bVar2;
  pointer pbVar3;
  ostream *poVar4;
  string *__lhs;
  bool bVar5;
  allocator<char> local_29d;
  mode_t mode;
  cmCommand *local_298;
  string dir;
  string error;
  string message;
  ofstream file;
  
  fileName = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar3 - (long)fileName) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&file,"called with incorrect number of arguments",
               (allocator<char> *)&message);
    cmCommand::SetError(&this->super_cmCommand,(string *)&file);
    std::__cxx11::string::~string((string *)&file);
    bVar5 = false;
  }
  else {
    message._M_dataplus._M_p = (pointer)&message.field_2;
    message._M_string_length = 0;
    message.field_2._M_local_buf[0] = '\0';
    bVar5 = true;
    __lhs = fileName;
    local_298 = &this->super_cmCommand;
    while (this_00 = local_298, __lhs = __lhs + 1, __lhs != pbVar3) {
      bVar2 = std::operator==(__lhs,"APPEND");
      if (bVar2) {
        bVar5 = false;
      }
      else {
        std::__cxx11::string::append((string *)&message);
      }
      pbVar3 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    bVar2 = cmMakefile::CanIWriteThisFile(local_298->Makefile,fileName);
    if (bVar2) {
      cmsys::SystemTools::GetFilenamePath(&dir,fileName);
      cmsys::SystemTools::MakeDirectory(&dir,(mode_t *)0x0);
      mode = 0;
      bVar2 = cmsys::SystemTools::GetPermissions((fileName->_M_dataplus)._M_p,&mode);
      if (bVar2) {
        bVar2 = true;
        if (-1 < (char)mode) {
          bVar2 = false;
          cmsys::SystemTools::SetPermissions((fileName->_M_dataplus)._M_p,mode | 0x90,false);
        }
      }
      else {
        bVar2 = false;
      }
      _Var1 = _S_app;
      if (bVar5) {
        _Var1 = _S_out;
      }
      std::ofstream::ofstream(&file,(fileName->_M_dataplus)._M_p,_Var1);
      bVar5 = ((&file.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
               [(long)file.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                      [-3]] & 5) == 0;
      if (bVar5) {
        poVar4 = std::operator<<(&file.super_basic_ostream<char,_std::char_traits<char>_>,
                                 (string *)&message);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::ofstream::close();
        if (!bVar2 && mode != 0) {
          cmsys::SystemTools::SetPermissions((fileName->_M_dataplus)._M_p,mode,false);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&error,"Internal CMake error when trying to open file: ",&local_29d);
        std::__cxx11::string::append((string *)&error);
        std::__cxx11::string::append((char *)&error);
        cmCommand::SetError(this_00,&error);
        std::__cxx11::string::~string((string *)&error);
      }
      std::ofstream::~ofstream(&file);
      std::__cxx11::string::~string((string *)&dir);
    }
    else {
      std::operator+(&dir,"attempted to write a file: ",fileName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,&dir
                     ," into a source directory.");
      std::__cxx11::string::~string((string *)&dir);
      cmCommand::SetError(this_00,(string *)&file);
      cmSystemTools::s_FatalErrorOccured = true;
      std::__cxx11::string::~string((string *)&file);
      bVar5 = false;
    }
    std::__cxx11::string::~string((string *)&message);
  }
  return bVar5;
}

Assistant:

bool cmWriteFileCommand::InitialPass(std::vector<std::string> const& args,
                                     cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::string message;
  std::vector<std::string>::const_iterator i = args.begin();

  std::string const& fileName = *i;
  bool overwrite = true;
  i++;

  for (; i != args.end(); ++i) {
    if (*i == "APPEND") {
      overwrite = false;
    } else {
      message += *i;
    }
  }

  if (!this->Makefile->CanIWriteThisFile(fileName)) {
    std::string e =
      "attempted to write a file: " + fileName + " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  std::string dir = cmSystemTools::GetFilenamePath(fileName);
  cmSystemTools::MakeDirectory(dir);

  mode_t mode = 0;
  bool writable = false;

  // Set permissions to writable
  if (cmSystemTools::GetPermissions(fileName.c_str(), mode)) {
#if defined(_MSC_VER) || defined(__MINGW32__)
    writable = (mode & S_IWRITE) != 0;
    mode_t newMode = mode | S_IWRITE;
#else
    writable = mode & S_IWUSR;
    mode_t newMode = mode | S_IWUSR | S_IWGRP;
#endif
    if (!writable) {
      cmSystemTools::SetPermissions(fileName.c_str(), newMode);
    }
  }
  // If GetPermissions fails, pretend like it is ok. File open will fail if
  // the file is not writable
  cmsys::ofstream file(fileName.c_str(),
                       overwrite ? std::ios::out : std::ios::app);
  if (!file) {
    std::string error = "Internal CMake error when trying to open file: ";
    error += fileName;
    error += " for writing.";
    this->SetError(error);
    return false;
  }
  file << message << std::endl;
  file.close();
  if (mode && !writable) {
    cmSystemTools::SetPermissions(fileName.c_str(), mode);
  }

  return true;
}